

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void __thiscall es::init::ActionOnZero::operator()(ActionOnZero *this)

{
  bool bVar1;
  
  bVar1 = std::atomic<bool>::exchange(&operator()::activated,true,memory_order_seq_cst);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"ActionOnZero(): Already activated\n");
  }
  else {
    empty_stack();
  }
  return;
}

Assistant:

void operator()() const
    {
        static std::atomic<bool> activated{false};

        if constexpr (verbose_singletons)
            std::cout << "ActionOnZero(): calling empty_stack(): from: " << __PRETTY_FUNCTION__ << "\n";
        if (activated.exchange(true))
        {
            std::cout << "ActionOnZero(): Already activated\n";
            return;
        }
        empty_stack();
    }